

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::getFederateTag_abi_cxx11_(CommonCore *this,LocalFederateId fid,string_view tag)

{
  string_view message;
  string_view str;
  string_view tag_00;
  bool bVar1;
  long lVar2;
  char *__str;
  FederateState *in_RCX;
  long *in_RDI;
  __sv_type _Var3;
  undefined1 in_stack_000000c0 [16];
  string_view in_stack_000000d0;
  FederateState *fed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  value<fmt::v11::context> *this_00;
  size_t in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  CommonCore *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  LocalFederateId in_stack_fffffffffffffea4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_100 [32];
  __sv_type local_e0;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [32];
  undefined4 local_a0;
  FederateState *local_98;
  undefined1 local_88 [8];
  FederateState *local_80;
  LocalFederateId local_74;
  string *local_70;
  value<fmt::v11::context> local_68;
  undefined8 local_58;
  value<fmt::v11::context> *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  value<fmt::v11::context> *local_10;
  undefined8 *local_8;
  
  local_80 = in_RCX;
  local_98 = getFederateAt(in_stack_fffffffffffffe98,in_stack_fffffffffffffea4);
  local_a0 = 0xfffffefd;
  bVar1 = LocalFederateId::operator==(&local_74,(LocalFederateId)0xfffffefd);
  if (bVar1) {
    lVar2 = __tls_get_addr(&PTR_00a6ad20);
    if (*(char *)(lVar2 + 0x13b8) == '\0') {
      lVar2 = __tls_get_addr(&PTR_00a6ad20);
      lVar2 = lVar2 + 0x1398;
      std::__cxx11::string::string(in_stack_fffffffffffffe70);
      __cxa_thread_atexit(std::__cxx11::string::~string,lVar2,&__dso_handle);
      lVar2 = __tls_get_addr(&PTR_00a6ad20);
      *(undefined1 *)(lVar2 + 0x13b8) = 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe70,
               (char *)in_stack_fffffffffffffe68);
    local_18 = local_100;
    local_28 = "tag/{}";
    uStack_20 = 6;
    local_30 = local_88;
    local_48 = "tag/{}";
    uStack_40 = 6;
    this_00 = &local_68;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (this_00,in_stack_fffffffffffffe68);
    local_8 = &local_58;
    local_58 = 0xd;
    local_10 = this_00;
    local_50 = this_00;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_000000d0,(format_args)in_stack_000000c0);
    local_e0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe60);
    (**(code **)(*in_RDI + 0x2f0))
              (local_c0,in_RDI,local_d0,local_c8,local_e0._M_len,local_e0._M_str,1);
    __tls_get_addr(&PTR_00a6ad20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(in_stack_fffffffffffffe60);
    std::__cxx11::string::~string(in_stack_fffffffffffffe60);
    __tls_get_addr(&PTR_00a6ad20);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe60);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var3._M_len;
    str._M_len._4_4_ = in_stack_fffffffffffffea4.fid;
    str._M_len._0_4_ = in_stack_fffffffffffffea0;
    str._M_str = (char *)in_stack_fffffffffffffea8;
    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str);
    __tls_get_addr(&PTR_00a6ad20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_01,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(in_stack_fffffffffffffe60);
    lVar2 = __tls_get_addr(&PTR_00a6ad20);
    local_70 = (string *)(lVar2 + 0x1398);
  }
  else {
    if (local_98 == (FederateState *)0x0) {
      __str = (char *)__cxa_allocate_exception(0x28);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe70,__str
                );
      message._M_str = in_stack_fffffffffffffe80;
      message._M_len = in_stack_fffffffffffffe78;
      InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffe70,message);
      __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    }
    tag_00._M_len._4_4_ = in_stack_fffffffffffffea4.fid;
    tag_00._M_len._0_4_ = in_stack_fffffffffffffea0;
    tag_00._M_str = (char *)in_stack_fffffffffffffea8;
    local_70 = FederateState::getTag_abi_cxx11_(local_80,tag_00);
  }
  return local_70;
}

Assistant:

const std::string& CommonCore::getFederateTag(LocalFederateId fid, std::string_view tag) const
{
    auto* fed = getFederateAt(fid);
    if (fid == gLocalCoreId) {
        static thread_local std::string val;
        val = const_cast<CommonCore*>(this)->query(
            "core",
            fmt::format("tag/{}", tag),
            HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        val = gmlc::utilities::stringOps::removeQuotes(val);
        return val;
    }
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (getFederateTag)"));
    }

    return fed->getTag(tag);
}